

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Validator::Validator(Validator *this,Validator *param_2)

{
  long in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffffd8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffe0;
  
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_stack_ffffffffffffffe0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(in_RDI + 0x20));
  ::std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  *(undefined4 *)(in_RDI + 0x60) = *(undefined4 *)(in_RSI + 0x60);
  *(undefined2 *)(in_RDI + 100) = *(undefined2 *)(in_RSI + 100);
  return;
}

Assistant:

class Validator {
  protected:
    /// This is the description function, if empty the description_ will be used
    std::function<std::string()> desc_function_{[]() { return std::string{}; }};

    /// This is the base function that is to be called.
    /// Returns a string error message if validation fails.
    std::function<std::string(std::string &)> func_{[](std::string &) { return std::string{}; }};
    /// The name for search purposes of the Validator
    std::string name_{};
    /// A Validator will only apply to an indexed value (-1 is all elements)
    int application_index_ = -1;
    /// Enable for Validator to allow it to be disabled if need be
    bool active_{true};
    /// specify that a validator should not modify the input
    bool non_modifying_{false};

    Validator(std::string validator_desc, std::function<std::string(std::string &)> func)
        : desc_function_([validator_desc]() { return validator_desc; }), func_(std::move(func)) {}

  public:
    Validator() = default;
    /// Construct a Validator with just the description string
    explicit Validator(std::string validator_desc) : desc_function_([validator_desc]() { return validator_desc; }) {}
    /// Construct Validator from basic information
    Validator(std::function<std::string(std::string &)> op, std::string validator_desc, std::string validator_name = "")
        : desc_function_([validator_desc]() { return validator_desc; }), func_(std::move(op)),
          name_(std::move(validator_name)) {}
    /// Set the Validator operation function
    Validator &operation(std::function<std::string(std::string &)> op) {
        func_ = std::move(op);
        return *this;
    }
    /// This is the required operator for a Validator - provided to help
    /// users (CLI11 uses the member `func` directly)
    std::string operator()(std::string &str) const;

    /// This is the required operator for a Validator - provided to help
    /// users (CLI11 uses the member `func` directly)
    std::string operator()(const std::string &str) const {
        std::string value = str;
        return (active_) ? func_(value) : std::string{};
    }

    /// Specify the type string
    Validator &description(std::string validator_desc) {
        desc_function_ = [validator_desc]() { return validator_desc; };
        return *this;
    }
    /// Specify the type string
    CLI11_NODISCARD Validator description(std::string validator_desc) const;

    /// Generate type description information for the Validator
    CLI11_NODISCARD std::string get_description() const {
        if(active_) {
            return desc_function_();
        }
        return std::string{};
    }
    /// Specify the type string
    Validator &name(std::string validator_name) {
        name_ = std::move(validator_name);
        return *this;
    }